

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar4;
  params *ppVar5;
  color_quad_u8 *pcVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  component_t cVar11;
  ulong uVar12;
  int iVar13;
  undefined4 *puVar14;
  uint s;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint c;
  uint uVar19;
  uint uVar20;
  uint8 uVar21;
  color_quad_u8 block_colors [4];
  color_quad_u8 base_color;
  
  trial_solution->m_valid = false;
  ppVar5 = this->m_pParams;
  if (ppVar5->m_constrain_against_base_color5 == true) {
    iVar8 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(ppVar5->m_base_color5).field_0.field_0.r;
    iVar13 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar5->m_base_color5).field_0.field_0.g;
    iVar10 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar5->m_base_color5).field_0.field_0.b;
    iVar18 = iVar13;
    if (iVar8 < iVar13) {
      iVar18 = iVar8;
    }
    if (iVar10 <= iVar18) {
      iVar18 = iVar10;
    }
    if (iVar18 < -4) {
      return false;
    }
    if (iVar13 < iVar8) {
      iVar13 = iVar8;
    }
    if (iVar13 <= iVar10) {
      iVar13 = iVar10;
    }
    if (3 < iVar13) {
      return false;
    }
  }
  etc1_solution_coordinates::get_scaled_color((etc1_solution_coordinates *)&base_color);
  trial_solution->m_error = 0xffffffffffffffff;
  uVar9 = 0xffffffffffffffff;
  puVar14 = &g_etc1_inten_tables;
  lVar17 = 0;
  do {
    if (lVar17 == 8) {
      aVar4 = (coords->m_unscaled_color).field_0;
      (trial_solution->m_coords).m_unscaled_color.field_0 = aVar4;
      (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
      if ((pBest_solution != (potential_solution *)0x0) && (uVar9 < pBest_solution->m_error)) {
        (pBest_solution->m_coords).m_unscaled_color.field_0 = aVar4;
        (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
        (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
        uVar7 = *(undefined8 *)&trial_solution->field_0x14;
        *(undefined8 *)pBest_solution->m_selectors = *(undefined8 *)trial_solution->m_selectors;
        *(undefined8 *)&pBest_solution->field_0x14 = uVar7;
        *(undefined8 *)((long)&pBest_solution->m_error + 1) =
             *(undefined8 *)((long)&trial_solution->m_error + 1);
        return true;
      }
      return false;
    }
    for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
      iVar18 = puVar14[lVar16];
      iVar8 = iVar18 + (uint)base_color.field_0.field_0.r;
      iVar13 = iVar18 + (uint)base_color.field_0.field_0.g;
      iVar18 = iVar18 + (uint)base_color.field_0.field_0.b;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      cVar11 = (component_t)iVar8;
      if (0xfe < iVar8) {
        cVar11 = 0xff;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      if (0xfe < iVar13) {
        iVar13 = 0xff;
      }
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      block_colors[lVar16].field_0.field_0.r = cVar11;
      if (0xfe < iVar18) {
        iVar18 = 0xff;
      }
      block_colors[lVar16].field_0.field_0.g = (component_t)iVar13;
      block_colors[lVar16].field_0.field_0.b = (component_t)iVar18;
      block_colors[lVar16].field_0.field_0.a = '\0';
    }
    pcVar6 = this->m_pParams->m_pSrc_pixels;
    uVar12 = 0;
    for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
      bVar1 = pcVar6[lVar16].field_0.field_0.r;
      uVar15 = (uint)bVar1;
      bVar2 = pcVar6[lVar16].field_0.field_0.g;
      iVar18 = (uint)bVar2 - (uint)(byte)block_colors[0].field_0._1_1_;
      bVar3 = pcVar6[lVar16].field_0.field_0.b;
      iVar13 = (uint)bVar3 - (uint)(byte)block_colors[0].field_0._2_1_;
      uVar19 = iVar13 * iVar13 +
               iVar18 * iVar18 +
               (uVar15 - (byte)block_colors[0].field_0._0_1_) *
               (uVar15 - (byte)block_colors[0].field_0._0_1_);
      iVar18 = (uint)bVar1 - (uint)(byte)block_colors[1].field_0._0_1_;
      iVar13 = (uint)bVar2 - (uint)(byte)block_colors[1].field_0._1_1_;
      iVar8 = (uint)bVar3 - (uint)(byte)block_colors[1].field_0._2_1_;
      uVar20 = iVar8 * iVar8 + iVar13 * iVar13 + iVar18 * iVar18;
      uVar21 = uVar20 < uVar19;
      if (!(bool)uVar21) {
        uVar20 = uVar19;
      }
      iVar18 = (uint)bVar2 - (uint)(byte)block_colors[2].field_0._1_1_;
      iVar13 = (uint)bVar3 - (uint)(byte)block_colors[2].field_0._2_1_;
      uVar19 = iVar13 * iVar13 +
               iVar18 * iVar18 +
               (uVar15 - (byte)block_colors[2].field_0._0_1_) *
               (uVar15 - (byte)block_colors[2].field_0._0_1_);
      if (uVar19 < uVar20) {
        uVar21 = '\x02';
        uVar20 = uVar19;
      }
      iVar13 = (uint)bVar2 - (uint)(byte)block_colors[3].field_0._1_1_;
      iVar18 = (uint)bVar3 - (uint)(byte)block_colors[3].field_0._2_1_;
      uVar19 = iVar18 * iVar18 +
               iVar13 * iVar13 +
               (uVar15 - (byte)block_colors[3].field_0._0_1_) *
               (uVar15 - (byte)block_colors[3].field_0._0_1_);
      uVar15 = uVar19;
      if (uVar20 <= uVar19) {
        uVar15 = uVar20;
      }
      if (uVar20 > uVar19) {
        uVar21 = '\x03';
      }
      this->m_temp_selectors[lVar16] = uVar21;
      uVar12 = uVar12 + uVar15;
      uVar9 = trial_solution->m_error;
      if (uVar9 <= uVar12) break;
    }
    if (uVar12 < uVar9) {
      trial_solution->m_error = uVar12;
      (trial_solution->m_coords).m_inten_table = (uint)lVar17;
      *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
      trial_solution->m_valid = true;
      uVar9 = uVar12;
    }
    lVar17 = lVar17 + 1;
    puVar14 = puVar14 + 4;
  } while( true );
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = 8;

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = rg_etc1::square(src_pixel.r - block_colors[0].r) + rg_etc1::square(src_pixel.g - block_colors[0].g) + rg_etc1::square(src_pixel.b - block_colors[0].b);

      uint trial_error = rg_etc1::square(src_pixel.r - block_colors[1].r) + rg_etc1::square(src_pixel.g - block_colors[1].g) + rg_etc1::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[2].r) + rg_etc1::square(src_pixel.g - block_colors[2].g) + rg_etc1::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = rg_etc1::square(src_pixel.r - block_colors[3].r) + rg_etc1::square(src_pixel.g - block_colors[3].g) + rg_etc1::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      memcpy(trial_solution.m_selectors, m_temp_selectors, 8);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}